

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  float *pfVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  
  fVar2 = (this->super_Dropout).scale;
  if (fVar2 != 1.0) {
    if (bottom_top_blob->elempack != 4) {
      if ((this->super_Dropout).scale != 1.0) {
        uVar8 = bottom_top_blob->h * bottom_top_blob->w;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        uVar11 = 0;
        uVar13 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar13 = uVar11;
        }
        pvVar14 = bottom_top_blob->data;
        uVar12 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar12 = uVar11;
        }
        for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
          for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
            *(float *)((long)pvVar14 + uVar18 * 4) =
                 (this->super_Dropout).scale * *(float *)((long)pvVar14 + uVar18 * 4);
          }
          pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        }
      }
      return 0;
    }
    iVar9 = bottom_top_blob->dims;
    uVar8 = bottom_top_blob->w;
    uVar16 = bottom_top_blob->h;
    if (iVar9 == 3) {
      uVar13 = 0;
      iVar9 = uVar16 * uVar8;
      if ((int)(uVar16 * uVar8) < 1) {
        iVar9 = 0;
      }
      uVar11 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar11 = 0;
      }
      for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        pfVar15 = (float *)(bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        iVar17 = iVar9;
        while (bVar19 = iVar17 != 0, iVar17 = iVar17 + -1, bVar19) {
          *pfVar15 = *pfVar15 * fVar2;
          pfVar15[1] = pfVar15[1] * fVar2;
          pfVar15[2] = pfVar15[2] * fVar2;
          pfVar15[3] = pfVar15[3] * fVar2;
          pfVar15 = pfVar15 + 4;
        }
      }
    }
    else if (iVar9 == 2) {
      uVar13 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar11 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar11 = 0;
      }
      for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        pfVar15 = (float *)((long)bottom_top_blob->w * uVar13 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        uVar16 = uVar8;
        while (bVar19 = uVar16 != 0, uVar16 = uVar16 - 1, bVar19) {
          *pfVar15 = *pfVar15 * fVar2;
          pfVar15[1] = pfVar15[1] * fVar2;
          pfVar15[2] = pfVar15[2] * fVar2;
          pfVar15[3] = pfVar15[3] * fVar2;
          pfVar15 = pfVar15 + 4;
        }
      }
    }
    else if (iVar9 == 1) {
      lVar10 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (; (ulong)uVar8 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        pfVar15 = (float *)((long)bottom_top_blob->data + lVar10);
        fVar5 = pfVar15[1];
        fVar6 = pfVar15[2];
        fVar7 = pfVar15[3];
        pfVar1 = (float *)((long)bottom_top_blob->data + lVar10);
        *pfVar1 = *pfVar15 * fVar2;
        pfVar1[1] = fVar5 * fVar2;
        pfVar1[2] = fVar6 * fVar2;
        pfVar1[3] = fVar7 * fVar2;
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}